

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

bool __thiscall
ddd::DaTrie<true,_true,_false>::delete_key(DaTrie<true,_true,_false> *this,Query *query)

{
  uint node_pos;
  pointer pBVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  DaTrie<true,_true,_false> local_a8;
  
  bVar2 = search_key(this,query);
  if (bVar2) {
    if (query->node_pos_ == 0) {
      local_a8.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.blocks_.super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.blocks_.super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.blocks_.super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_a8.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_a8.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_a8.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.head_pos_ = 0xffffffff;
      local_a8.bc_emps_ = 0;
      local_a8.tail_emps_ = 0;
      swap(&local_a8,this);
      ~DaTrie(&local_a8);
    }
    else {
      delete_sib_(this,query->node_pos_);
      node_pos = query->node_pos_;
      uVar5 = (ulong)node_pos;
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = SUB84(pBVar1[uVar5],0);
      if ((-1 < (int)uVar4 || uVar5 == 0) ||
         ((*(uint *)(&pBVar1->field_0x0 + ((ulong)pBVar1[uVar5] >> 0x1d & 0x3fffffff8)) & 0x7fffffff
          ) != node_pos)) {
        sVar3 = strlen((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + (uVar4 & 0x7fffffff));
        this->tail_emps_ = (int)sVar3 + this->tail_emps_ + 5;
      }
      uVar4 = *(uint *)&pBVar1[uVar5].field_0x4;
      unfix_(this,node_pos,&this->blocks_);
      query->node_pos_ = uVar4 & 0x7fffffff;
      query->is_finished_ = false;
      query->pos_ = query->pos_ - 1;
      change_branch_(this,query);
    }
  }
  return bVar2;
}

Assistant:

bool delete_key(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    if (!search_key(query)) {
      return false;
    }

    if (query.node_pos() == ROOT_POS) {
      DaTrie().swap(*this);
      return true;
    }

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    if (!is_terminal_(query.node_pos())) {
      auto tail_pos = bc_[query.node_pos()].value();
      tail_emps_ += utils::length(tail_.data() + tail_pos) + sizeof(uint32_t);
    }

    auto parent_pos = bc_[query.node_pos()].check();
    unfix_(query.node_pos(), blocks_);
    query.prev(parent_pos);

    change_branch_(query);
    return true;
  }